

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

void __thiscall IR::Instr::InsertMultipleBefore(Instr *this,Instr *endInstr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  
  pIVar1 = endInstr->m_prev;
  if (endInstr->m_prev != (Instr *)0x0) {
    do {
      pIVar5 = pIVar1;
      pIVar1 = pIVar5->m_prev;
    } while (pIVar5->m_prev != (Instr *)0x0);
    pIVar1 = this->m_prev;
    pIVar5->m_prev = pIVar1;
    this->m_prev = endInstr;
    if (pIVar1 != (Instr *)0x0) {
      pIVar1->m_next = pIVar5;
    }
    endInstr->m_next = this;
    return;
  }
  if (endInstr->m_next != (Instr *)0x0 || endInstr->m_prev != (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,199,"(!instr->IsLinked())","!instr->IsLinked()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pIVar1 = this->m_prev;
  endInstr->m_prev = pIVar1;
  this->m_prev = endInstr;
  if (pIVar1 != (Instr *)0x0) {
    pIVar1->m_next = endInstr;
  }
  endInstr->m_next = this;
  return;
}

Assistant:

void
Instr::InsertMultipleBefore(Instr *endInstr)
{
    Instr *startInstr = endInstr->m_prev;

    if (startInstr) // more than one instruction to insert
    {
        while (startInstr->m_prev)
        {
            startInstr = startInstr->m_prev;
        }
        return this->InsertRangeBefore(startInstr, endInstr);
    }
    return this->InsertBefore(endInstr);
}